

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O2

Section * dummy_section(GlobalVars *gv,ObjectUnit *ou)

{
  LinkedSection *pLVar1;
  Section *pSVar2;
  
  pSVar2 = gv->dummysec;
  if (pSVar2 == (Section *)0x0) {
    pLVar1 = (LinkedSection *)alloczero(0xd0);
    pSVar2 = add_section(ou,"*linker*",(uint8_t *)0x0,0,'\x04','\x03','\x03','\0',1);
    pSVar2->lnksec = pLVar1;
    pLVar1->name = pSVar2->name;
    pLVar1->type = pSVar2->type;
    pLVar1->flags = pSVar2->flags;
    pLVar1->protection = pSVar2->protection;
    pLVar1->index = -1;
    initlist(&pLVar1->sections);
    initlist(&pLVar1->relocs);
    initlist(&pLVar1->xrefs);
    initlist(&pLVar1->symbols);
    gv->dummysec = pSVar2;
  }
  return pSVar2;
}

Assistant:

struct Section *dummy_section(struct GlobalVars *gv,struct ObjectUnit *ou)
/* Make a dummy section already attached to a dummy-LinkedSection, which
   won't appear in any section lists.
   Can be used for relocatable linker symbols, which need a specific value. */
{
  struct Section *s;

  if (!(s = gv->dummysec)) {
    struct LinkedSection *ls = alloczero(sizeof(struct LinkedSection));

    s = add_section(ou,"*linker*",NULL,0,ST_TMP,
                    SF_ALLOC|SF_UNINITIALIZED,SP_READ|SP_WRITE,0,TRUE);
    s->lnksec = ls;
    ls->name = s->name;
    ls->type = s->type;
    ls->flags = s->flags;
    ls->protection = s->protection;
    ls->index = INVALID;
    initlist(&ls->sections);
    initlist(&ls->relocs);
    initlist(&ls->xrefs);
    initlist(&ls->symbols);
    gv->dummysec = s;
  }
  return s;
}